

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_glm4::llm_build_glm4
          (llm_build_glm4 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  ggml_tensor *pgVar6;
  const_reference pvVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_tensor *name;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  ggml_tensor *pgVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *pgVar14;
  pointer plVar15;
  ggml_tensor *pgVar16;
  void *in_RCX;
  long in_RSI;
  long in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_gqa;
  int64_t n_embd_head;
  ggml_type local_2d8;
  uint32_t il_00;
  llama_hparams *in_stack_fffffffffffffd30;
  ggml_tensor *in_stack_fffffffffffffd38;
  ggml_tensor *mb;
  ggml_tensor *in_stack_fffffffffffffd40;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd48;
  undefined4 uVar17;
  llm_graph_context *in_stack_fffffffffffffd50;
  ggml_tensor *in_stack_fffffffffffffd80;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffdc0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *pgVar18;
  ggml_tensor *gate_s;
  ggml_tensor *in_stack_fffffffffffffdf0;
  ggml_tensor *in_stack_fffffffffffffdf8;
  ggml_tensor *in_stack_fffffffffffffe00;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  int il_01;
  void *pvVar19;
  ggml_tensor *in_stack_fffffffffffffe38;
  llm_graph_context *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_fffffffffffffef8;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_tensor *in_stack_ffffffffffffff08;
  ggml_cgraph *in_stack_ffffffffffffff10;
  ggml_tensor *in_stack_ffffffffffffff18;
  ggml_tensor *in_stack_ffffffffffffff20;
  ggml_tensor *pgVar20;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  ggml_tensor *local_78;
  ggml_tensor *local_70;
  int local_64;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd40,
             (llm_graph_params *)in_stack_fffffffffffffd38);
  uVar1 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  uVar3 = llama_hparams::n_embd_v_gqa(in_stack_fffffffffffffd30,il_00);
  if (uVar1 == *(uint *)(*(long *)(in_RDI + 8) + 0x20)) {
    local_50 = llm_graph_context::build_inp_embd
                         (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    pgVar20 = local_50;
    pgVar4 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffd90);
    pgVar14 = pgVar4;
    pgVar5 = (ggml_tensor *)
             llm_graph_context::build_attn_inp_kv_unified
                       ((llm_graph_context *)in_stack_fffffffffffffdd0);
    pgVar16 = pgVar5;
    for (local_64 = 0; (long)local_64 < *(long *)(in_RDI + 0x28); local_64 = local_64 + 1) {
      local_70 = local_50;
      pgVar11 = local_50;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar6 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                          in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                          (int)in_stack_fffffffffffffd30);
      uVar17 = (undefined4)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      if (pvVar7->wqkv == (ggml_tensor *)0x0) {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_78 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar7->bq != (ggml_tensor *)0x0) {
          in_stack_ffffffffffffff10 = *(ggml_cgraph **)(in_RDI + 0xc0);
          pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          in_stack_ffffffffffffff20 =
               (ggml_tensor *)ggml_add(in_stack_ffffffffffffff10,local_78,pvVar7->bq);
          in_stack_ffffffffffffff18 = local_78;
          local_78 = in_stack_ffffffffffffff20;
        }
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_80 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        in_stack_ffffffffffffff08 = local_80;
        pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar7->bk != (ggml_tensor *)0x0) {
          in_stack_fffffffffffffef0 = *(undefined8 *)(in_RDI + 0xc0);
          pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          in_stack_ffffffffffffff00 =
               (ggml_tensor *)ggml_add(in_stack_fffffffffffffef0,local_80,pvVar7->bk);
          in_stack_fffffffffffffef8 = local_80;
          local_80 = in_stack_ffffffffffffff00;
        }
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_88 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar7->bv != (ggml_tensor *)0x0) {
          uVar8 = *(undefined8 *)(in_RDI + 0xc0);
          pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          local_88 = (ggml_tensor *)ggml_add(uVar8,local_88,pvVar7->bv);
        }
      }
      else {
        std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                  ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                   (long)local_64);
        local_48 = llm_graph_context::build_lora_mm
                             ((llm_graph_context *)in_stack_fffffffffffffd90,
                              in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        llm_graph_context::cb
                  ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   &in_stack_fffffffffffffd30->vocab_only,il_00);
        pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                           ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                            (long)local_64);
        if (pvVar7->bqkv != (ggml_tensor *)0x0) {
          uVar8 = *(undefined8 *)(in_RDI + 0xc0);
          pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                             ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0)
                              ,(long)local_64);
          local_48 = (ggml_tensor *)ggml_add(uVar8,local_48,pvVar7->bqkv);
          llm_graph_context::cb
                    ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     &in_stack_fffffffffffffd30->vocab_only,il_00);
        }
        uVar8 = *(undefined8 *)(in_RDI + 0xc0);
        uVar9 = ggml_view_2d(uVar8,local_48,*(undefined8 *)(in_RDI + 0x20),
                             (long)*(int *)(in_RDI + 0xa8),local_48->nb[1],0);
        local_78 = (ggml_tensor *)ggml_cont(uVar8,uVar9);
        uVar8 = *(undefined8 *)(in_RDI + 0xc0);
        uVar9 = ggml_view_2d(uVar8,local_48,uVar3,(long)*(int *)(in_RDI + 0xa8),local_48->nb[1],
                             *(long *)(in_RDI + 0x20) << 2);
        local_80 = (ggml_tensor *)ggml_cont(uVar8,uVar9);
        uVar8 = *(undefined8 *)(in_RDI + 0xc0);
        uVar9 = ggml_view_2d();
        local_88 = (ggml_tensor *)ggml_cont(uVar8,uVar9);
      }
      uVar8 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_78,uVar1,
                              *(undefined8 *)(in_RDI + 0x48),(long)*(int *)(in_RDI + 0xa8));
      uVar9 = ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_80,uVar1,
                              *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      name = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),local_88,uVar1,
                             *(undefined8 *)(in_RDI + 0x50),(long)*(int *)(in_RDI + 0xa8));
      local_2d8 = *(ggml_type *)(in_RDI + 0xb0);
      ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                    *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                    *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                    *(undefined8 *)(in_RDI + 0xc0),uVar8,pgVar4,0,*(undefined4 *)(in_RDI + 0x30),
                    *(undefined4 *)(in_RDI + 0xb8));
      local_2d8 = *(ggml_type *)(in_RDI + 0xb0);
      pgVar10 = (ggml_tensor *)
                ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                              *(undefined4 *)(in_RDI + 0x90),*(undefined4 *)(in_RDI + 0x94),
                              *(undefined4 *)(in_RDI + 0x98),*(undefined4 *)(in_RDI + 0x9c),
                              *(undefined8 *)(in_RDI + 0xc0),uVar9,pgVar4,0,
                              *(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      pgVar18 = pgVar5;
      pvVar19 = in_RCX;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      il_01 = (int)pvVar19;
      type_gate = (llm_ffn_gate_type)pgVar18;
      sqrtf((float)uVar1);
      _local_2d8 = pgVar10;
      pgVar13 = (ggml_tensor *)CONCAT44(uVar17,local_64);
      mw = (ggml_tensor *)0x0;
      mb = (ggml_tensor *)0x0;
      pgVar10 = name;
      pgVar18 = _local_2d8;
      local_48 = llm_graph_context::build_attn
                           ((llm_graph_context *)in_stack_ffffffffffffff20,
                            (llm_graph_input_attn_kv_unified *)in_stack_ffffffffffffff18,
                            in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,pgVar11,pgVar6,
                            pgVar16,pgVar14,(float)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                            (int)pgVar20);
      type_op = (llm_ffn_op_type)pgVar18;
      if ((long)local_64 == *(long *)(in_RDI + 0x28) + -1) {
        pgVar11 = llm_graph_context::build_inp_out_ids
                            ((llm_graph_context *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffe00 = pgVar11;
        local_48 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_48,pgVar11);
        in_stack_fffffffffffffdf8 = local_48;
        in_stack_fffffffffffffdf0 =
             (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_50,pgVar11);
        local_70 = in_stack_fffffffffffffdf0;
      }
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar6 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffd50,pgVar13,mw,mb,
                          (llm_norm_type)((ulong)name >> 0x20),(int)name);
      pgVar11 = _local_2d8;
      il_00 = (uint32_t)((ulong)_local_2d8 >> 0x20);
      iVar2 = il_00;
      _local_2d8 = pgVar11;
      gate_s = pgVar6;
      llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,iVar2);
      pgVar12 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar6,local_70);
      pgVar11 = _local_2d8;
      il_00 = (uint32_t)((ulong)_local_2d8 >> 0x20);
      iVar2 = il_00;
      _local_2d8 = pgVar11;
      llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,iVar2);
      pgVar6 = pgVar12;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar13 = llm_graph_context::build_norm
                          (in_stack_fffffffffffffd50,pgVar13,mw,mb,
                           (llm_norm_type)((ulong)name >> 0x20),(int)name);
      pgVar11 = _local_2d8;
      il_00 = (uint32_t)((ulong)_local_2d8 >> 0x20);
      iVar2 = il_00;
      _local_2d8 = pgVar11;
      pgVar18 = pgVar13;
      llm_graph_context::cb((llm_graph_context *)mw,mb,(char *)name,iVar2);
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      pgVar11 = pvVar7->ffn_up;
      pvVar7 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)local_64);
      in_stack_fffffffffffffd38 = pvVar7->ffn_down;
      in_stack_fffffffffffffd50 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffd48 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd40 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffd30 = (llama_hparams *)0x0;
      local_2d8 = GGML_TYPE_F32;
      il_00 = 0;
      in_stack_fffffffffffffdc0 =
           llm_graph_context::build_ffn
                     ((llm_graph_context *)pgVar18,pgVar6,in_stack_fffffffffffffdc0,
                      (ggml_tensor *)&local_2d8,pgVar11,pgVar13,local_48,gate_s,
                      in_stack_fffffffffffffdf0,in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00,
                      pgVar10,type_op,type_gate,il_01);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)local_64);
      pgVar11 = llm_graph_context::build_norm
                          (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                           (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                           (int)in_stack_fffffffffffffd30);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
      local_50 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar11,pgVar12);
      in_stack_fffffffffffffd90 = local_50;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 &in_stack_fffffffffffffd30->vocab_only,il_00);
    }
    pgVar14 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                         (llm_norm_type)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                         (int)in_stack_fffffffffffffd30);
    pgVar16 = pgVar14;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,il_00);
    plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4f0cbc);
    plVar15->t_embd = pgVar14;
    pgVar16 = llm_graph_context::build_lora_mm
                        ((llm_graph_context *)in_stack_fffffffffffffd90,pgVar16,
                         in_stack_fffffffffffffd80);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               &in_stack_fffffffffffffd30->vocab_only,il_00);
    plVar15 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                        ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                         0x4f0d41);
    plVar15->t_logits = pgVar16;
    ggml_build_forward_expand(in_RCX,pgVar16);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
             ,0x2ad2,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
}

Assistant:

llm_build_glm4(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;
        const int64_t n_embd_gqa  = hparams.n_embd_v_gqa();

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // Pre-attention norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm,
                    NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                ggml_tensor * Qcur = nullptr;
                ggml_tensor * Kcur = nullptr;
                ggml_tensor * Vcur = nullptr;

                if (model.layers[il].wqkv == nullptr) {
                    Qcur = build_lora_mm(model.layers[il].wq, cur);
                    if (model.layers[il].bq) {
                        Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                    }
                    Kcur = build_lora_mm(model.layers[il].wk, cur);
                    if (model.layers[il].bk) {
                        Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                    }
                    Vcur = build_lora_mm(model.layers[il].wv, cur);
                    if (model.layers[il].bv) {
                        Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                    }
                } else {
                    cur = build_lora_mm(model.layers[il].wqkv, cur);
                    cb(cur, "wqkv", il);
                    if (model.layers[il].bqkv) {
                        cur = ggml_add(ctx0, cur, model.layers[il].bqkv);
                        cb(cur, "bqkv", il);
                    }
                    Qcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd,     n_tokens, cur->nb[1], 0*sizeof(float)*(n_embd)));
                    Kcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd)));
                    Vcur = ggml_cont(ctx0, ggml_view_2d(ctx0, cur, n_embd_gqa, n_tokens, cur->nb[1], 1*sizeof(float)*(n_embd + n_embd_gqa)));
                }

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_ext(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_ext(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, NULL,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            // Post-attention norm (new!)
            cur = build_norm(cur,
                    model.layers[il].attn_post_norm,
                    NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "post_attn_norm", il);

            // Add the input (residual connection after post-attention norm)
            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // FF
            {
                // Pre-MLP norm
                cur = build_norm(ffn_inp,
                        model.layers[il].ffn_norm,
                        NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "ffn_norm", il);

                // MLP
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        NULL,                      NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SWIGLU, LLM_FFN_SEQ, il);
                cb(cur, "ffn_out", il);

                // Post-MLP norm
                cur = build_norm(cur,
                        model.layers[il].ffn_post_norm,
                        NULL,
                        LLM_NORM_RMS, il);
                cb(cur, "post_mlp_norm", il);
            }

            // Add residual connection after post-MLP norm
            inpL = ggml_add(ctx0, cur, ffn_inp);
            cb(inpL, "l_out", il);
        }

        // Final norm
        cur = build_norm(inpL,
                model.output_norm,
                NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // Output projection
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }